

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ping-pong.cpp
# Opt level: O2

void __thiscall Wall::do_start(Wall *this,actor_ref *param_1,msg_start *msg)

{
  int iVar1;
  int i;
  int iVar2;
  msg_ball local_29;
  
  acto::actor_ref::operator=(&this->m_console,&msg->console);
  for (iVar2 = 0; iVar2 < msg->balls; iVar2 = iVar2 + 1) {
    iVar1 = rand();
    acto::actor_ref::send<msg_ball>(this->m_players + iVar1 % 10000,&local_29);
  }
  return;
}

Assistant:

void do_start(acto::actor_ref, const msg_start& msg) {
    m_console = msg.console;

    // Послать мячи в игру
    for (int i = 0; i < msg.balls; i++)
      m_players[ (rand() % PLAYERS) ].send(msg_ball());
  }